

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

bool dirIfIfn(aint *val)

{
  int iVar1;
  aint *val_local;
  
  IsLabelNotFound = false;
  iVar1 = ParseExpression(&lp,val);
  if (iVar1 == 0) {
    Error("[IF/IFN] Syntax error",lp,IF_FIRST);
    val_local._7_1_ = false;
  }
  else {
    if ((IsLabelNotFound & 1U) != 0) {
      WarningById(W_FWD_REF,bp,W_EARLY);
    }
    val_local._7_1_ = true;
  }
  return val_local._7_1_;
}

Assistant:

static bool dirIfIfn(aint & val) {
	IsLabelNotFound = false;
	if (!ParseExpression(lp, val)) {
		Error("[IF/IFN] Syntax error", lp, IF_FIRST);
		return false;
	}
	if (IsLabelNotFound) {
		WarningById(W_FWD_REF, bp, W_EARLY);
	}
	return true;
}